

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwd.hh
# Opt level: O3

void tchecker::ts::next<tchecker::ta::ta_t>
               (ta_t *fwd_impl,const_state_t *s,
               vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
               *v,state_status_t mask)

{
  bool bVar1;
  end_iterator_t __end0;
  outgoing_edges_iterator_t __begin0;
  outgoing_edges_range_t out_edges;
  end_iterator_t local_2c1;
  sync_edges_t local_2c0;
  outgoing_edges_iterator_t local_278;
  outgoing_edges_iterator_t local_158;
  
  ta::ta_t::outgoing_edges((outgoing_edges_range_t *)&local_158,fwd_impl,s);
  syncprod::outgoing_edges_iterator_t::outgoing_edges_iterator_t(&local_278,&local_158);
  while( true ) {
    bVar1 = syncprod::outgoing_edges_iterator_t::operator==(&local_278,&local_2c1);
    if (bVar1) break;
    syncprod::outgoing_edges_iterator_t::operator*(&local_2c0,&local_278);
    ta::ta_t::next(fwd_impl,s,&local_2c0,v,mask);
    range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t>::~range_t
              (&local_2c0.edges);
    syncprod::outgoing_edges_iterator_t::operator++(&local_278);
  }
  syncprod::outgoing_edges_iterator_t::~outgoing_edges_iterator_t(&local_278);
  syncprod::outgoing_edges_iterator_t::~outgoing_edges_iterator_t(&local_158);
  return;
}

Assistant:

void next(FWD_IMPL & fwd_impl, typename FWD_IMPL::const_state_t const & s, std::vector<typename FWD_IMPL::sst_t> & v,
          tchecker::state_status_t mask)
{
  typename FWD_IMPL::outgoing_edges_range_t out_edges = fwd_impl.outgoing_edges(s);
  for (typename FWD_IMPL::outgoing_edges_value_t && out_edge : out_edges)
    fwd_impl.next(s, out_edge, v, mask);
}